

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O3

wstring * ON_UTF32_to_std_wstring_abi_cxx11_
                    (wstring *__return_storage_ptr__,int bTestByteOrder,ON__UINT32 *sUTF32,
                    int sUTF32_count,uint *error_status,uint error_mask,ON__UINT32 error_code_point,
                    ON__UINT32 **sEndElement)

{
  ON__UINT32 OVar1;
  uint uVar2;
  ON__UINT32 *pOVar3;
  uint uVar4;
  uint uVar5;
  undefined4 in_register_0000008c;
  uint es;
  wstring *local_850;
  ON__UINT32 *sNextElement;
  undefined8 local_840;
  wchar_t buffer [512];
  
  local_840 = CONCAT44(in_register_0000008c,error_mask);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  if (sUTF32 != (ON__UINT32 *)0x0 && sUTF32_count == -1) {
    sUTF32_count = -1;
    pOVar3 = sUTF32;
    do {
      sUTF32_count = sUTF32_count + 1;
      OVar1 = *pOVar3;
      pOVar3 = pOVar3 + 1;
    } while (OVar1 != 0);
  }
  buffer[0x1ff] = L'\0';
  if (error_status != (uint *)0x0) {
    *error_status = 0;
  }
  local_850 = __return_storage_ptr__;
  do {
    es = 0;
    sNextElement = (ON__UINT32 *)0x0;
    uVar2 = ON_ConvertUTF32ToWideChar
                      (bTestByteOrder,sUTF32,sUTF32_count,buffer,0x1ff,&es,(uint)local_840,
                       error_code_point,&sNextElement);
    uVar5 = (uint)((ulong)((long)sNextElement - (long)sUTF32) >> 2);
    if (sNextElement <= sUTF32) {
      uVar5 = 0;
    }
    uVar4 = 0;
    if (uVar2 < 0x200) {
      uVar4 = uVar2;
    }
    buffer[(int)uVar4] = L'\0';
    if (sUTF32 == (ON__UINT32 *)0x0) {
      uVar5 = 0;
    }
    if (0x1fe < uVar2 - 1) {
      uVar2 = 0;
    }
    if ((int)uVar5 < 1) {
      uVar2 = 0;
    }
    if (((0 < (int)uVar2) &&
        (std::__cxx11::wstring::append((wchar_t *)local_850,(ulong)buffer), 0 < (int)uVar5)) &&
       ((es & 2) != 0)) {
      es = es & 0xfffffffd;
    }
    if (error_status != (uint *)0x0) {
      *error_status = *error_status | es;
    }
    sUTF32 = sUTF32 + (int)uVar5;
    sUTF32_count = sUTF32_count - uVar5;
    bTestByteOrder = 0;
  } while ((((es & 3) == 0 && 0 < (int)uVar5) && 0 < sUTF32_count) && 0 < (int)uVar2);
  if (sEndElement != (ON__UINT32 **)0x0) {
    *sEndElement = sUTF32;
  }
  return local_850;
}

Assistant:

std::wstring ON_UTF32_to_std_wstring(
  int bTestByteOrder,
  const ON__UINT32* sUTF32,
  int sUTF32_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  const ON__UINT32** sEndElement
  ) ON_NOEXCEPT
{
  std::wstring str;
  wchar_t buffer[512];
  const int buffer_count = static_cast<int>(sizeof(buffer)/sizeof(buffer[0]));
  unsigned int es;
  const ON__UINT32* sNextElement;

  if ( -1 == sUTF32_count && 0 != sUTF32 )
  {
    for ( sUTF32_count = 0; 0 != sUTF32[sUTF32_count]; sUTF32_count++)
    {
      // empty for body
    }
  }

  buffer[buffer_count-1] = 0;

  if ( 0 != error_status )
    *error_status = 0;

  for(;;)
  {
    es = 0;
    sNextElement = 0;
    int rc = ON_ConvertUTF32ToWideChar(
      bTestByteOrder, sUTF32, sUTF32_count,
      buffer, buffer_count-1,
      &es, error_mask, error_code_point,
      &sNextElement
      );

    // insure buffer[] is null terminated.
    buffer[( rc >= 0 && rc < buffer_count) ? rc : 0] = 0;

    // in_count = number of input sUTF32[] elements that were processed
    int in_count = ( 0 != sNextElement && 0 != sUTF32 && sNextElement > sUTF32 )
      ? static_cast<int>(sNextElement - sUTF32)
      : 0;

    // out_count = number of UTF-8 output values
    int out_count = ( in_count > 0 && rc > 0 && rc < buffer_count) ? rc : 0;

    if ( out_count > 0 )
    {
      try {
        str.append(buffer,out_count);
      } catch (const std::exception& ) {
        es |= 2;
        in_count = 0;
        out_count = 0;
      }
    }

    sUTF32 += in_count;
    sUTF32_count -= in_count;

    if ( 0 != (0x02 & es) && in_count > 0 && out_count > 0 )
    {
      // buffer[] was not long enough and we made progress.
      // Clear bit 2 and allow further processing
      es &= 0xFFFFFFFD;
    }

    if ( 0 != error_status )
      *error_status |= es;

    if ( sUTF32_count > 0 && in_count > 0 && out_count > 0 && 0 == (es & 3) )
    {
      // There were no blocking errors, we made progress, and there is more input
      bTestByteOrder = false;
      continue;
    }

    break; // finished
  }

  if ( sEndElement )
    *sEndElement = sUTF32;

  // On modern compilers, this return will use an efficient rvalue reference.
  return str;
}